

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprPartidxExprLookup(Parse *pParse,Expr *pExpr,int iTarget)

{
  int p1;
  long in_RSI;
  long in_RDI;
  int ret;
  int addr;
  Vdbe *v;
  IndexedExpr *p;
  int in_stack_0000018c;
  Expr *in_stack_00000190;
  Parse *in_stack_00000198;
  int in_stack_ffffffffffffffb8;
  int val;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int op;
  Vdbe *p_00;
  long local_28;
  int in_stack_ffffffffffffffe0;
  
  local_28 = *(long *)(in_RDI + 0x68);
  while( true ) {
    if (local_28 == 0) {
      return 0;
    }
    if (((int)*(short *)(in_RSI + 0x30) == *(int *)(local_28 + 0x10)) &&
       (*(int *)(in_RSI + 0x2c) == *(int *)(local_28 + 8))) break;
    local_28 = *(long *)(local_28 + 0x18);
  }
  p_00 = *(Vdbe **)(in_RDI + 0x10);
  op = 0;
  if (*(char *)(local_28 + 0x14) != '\0') {
    op = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  p1 = sqlite3ExprCodeTarget(in_stack_00000198,in_stack_00000190,in_stack_0000018c);
  val = 1;
  sqlite3VdbeAddOp4(p_00,op,p1,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,1),in_stack_ffffffffffffffe0);
  if (op == 0) {
    return p1;
  }
  sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
  sqlite3VdbeChangeP3((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,val);
  return p1;
}

Assistant:

static int exprPartidxExprLookup(Parse *pParse, Expr *pExpr, int iTarget){
  IndexedExpr *p;
  for(p=pParse->pIdxPartExpr; p; p=p->pIENext){
    if( pExpr->iColumn==p->iIdxCol && pExpr->iTable==p->iDataCur ){
      Vdbe *v = pParse->pVdbe;
      int addr = 0;
      int ret;

      if( p->bMaybeNullRow ){
        addr = sqlite3VdbeAddOp1(v, OP_IfNullRow, p->iIdxCur);
      }
      ret = sqlite3ExprCodeTarget(pParse, p->pExpr, iTarget);
      sqlite3VdbeAddOp4(pParse->pVdbe, OP_Affinity, ret, 1, 0,
                        (const char*)&p->aff, 1);
      if( addr ){
        sqlite3VdbeJumpHere(v, addr);
        sqlite3VdbeChangeP3(v, addr, ret);
      }
      return ret;
    }
  }
  return 0;
}